

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

void REVassoc_terminal_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  CMFormat format;
  FMStructDescList format_list;
  EVSimpleHandlerFunc handler;
  EV_int_response response;
  undefined4 local_30;
  EVaction local_2c;
  
  format = CMlookup_format(conn->cm,EV_int_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_int_response_formats);
  }
  format_list = REVPlookup_format_structs(conn->cm,*(char **)((long)data + 8));
  handler = REVPlookup_handler(*(char **)((long)data + 0x10));
  local_2c = EVassoc_terminal_action
                       (cm,*(EVstone *)((long)data + 4),format_list,handler,(void *)0x0);
  local_30 = *data;
  CMwrite(conn,format,&local_30);
  return;
}

Assistant:

static void
REVassoc_terminal_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVassoc_terminal_action_request *request = (EVassoc_terminal_action_request *) data;
    EVaction ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    FMStructDescList format_list = REVPlookup_format_structs(conn->cm, request->format_list);
    EVSimpleHandlerFunc handler = REVPlookup_handler(request->handler);
    ret = EVassoc_terminal_action(cm, request->stone, format_list, handler, NULL);
    response.ret = (int) ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}